

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::RestrainSide
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,int side,TPZInterpolatedElement *large,
          int neighbourside)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  long lVar11;
  TPZConnect *pTVar12;
  TPZGeoEl *pTVar13;
  ulong uVar14;
  TPZFMatrix<double> *this_00;
  double *pdVar15;
  int64_t myindex;
  int64_t iVar16;
  TPZDepend *pTVar17;
  uint uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  size_t lineN;
  int jn;
  ulong uVar21;
  int64_t size;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int jn_2;
  int iVar25;
  TNode *pTVar26;
  double local_3c18;
  ulong local_3bf0;
  TPZAutoPointer<TPZMatrix<double>_> local_3b98;
  REAL weight;
  TPZVec<double> centerPoint;
  TPZGeoElSide thisGeoSide;
  REAL detjac;
  TPZGeoElSide largeGeoSide;
  TPZCompElSide largeCompSide;
  TPZManVector<double,_3> par;
  TPZManVector<double,_3> pointl;
  TPZFMatrix<double> local_3ab0;
  double local_3a20 [101];
  TPZGeoElSide local_36f8;
  TPZFMatrix<double> local_36e0;
  double local_3650 [10];
  TPZFMatrix<double> local_3600;
  double local_3570 [10];
  TPZFMatrix<double> local_3520;
  double local_3490 [10];
  TPZFMatrix<double> local_3440;
  double local_33b0 [101];
  TPZBlock MBlocklarge;
  TPZBlock MBlocksmall;
  TPZStepSolver<double> MSolve;
  TPZFMatrix<double> local_2560;
  double local_24d0 [101];
  TPZTransform<double> t;
  TPZFMatrix<double> local_2008;
  double local_1f78 [1001];
  
  largeCompSide.fEl = (TPZCompEl *)large;
  largeCompSide.fSide = neighbourside;
  thisGeoSide.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  thisGeoSide.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  thisGeoSide.fSide = side;
  TPZCompElSide::Reference(&largeGeoSide,&largeCompSide);
  iVar4 = TPZGeoElSide::Dimension(&thisGeoSide);
  iVar5 = TPZGeoElSide::Dimension(&largeGeoSide);
  if ((largeCompSide.fEl == (TPZCompEl *)0x0) ||
     (plVar10 = (long *)__dynamic_cast(largeCompSide.fEl,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0), plVar10 == (long *)0x0)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - null computational element.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    return;
  }
  iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  if (iVar6 < 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,0x2a6);
  }
  lVar11 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0xa8))(this,iVar6);
  if (*(int *)(lVar11 + 0x18) == 0) {
    return;
  }
  if ((0 < iVar5) && (*(long *)(lVar11 + 0x20) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RestrainSide - unnecessary call to restrainside",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,0x2af);
  }
  uVar7 = (**(code **)(*plVar10 + 0x310))(plVar10,largeCompSide.fSide);
  lVar11 = (**(code **)(*plVar10 + 0xa0))(plVar10,uVar7);
  if (lVar11 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - Side of large element not initialized",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    lineN = 0x2b3;
LAB_01226555:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,lineN);
  }
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - dimension of large element is 0",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    lineN = 0x2b8;
    goto LAB_01226555;
  }
  TPZTransform<double>::TPZTransform(&t,iVar4);
  local_36f8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_36f8.fGeoEl = largeGeoSide.fGeoEl;
  local_36f8.fSide = largeGeoSide.fSide;
  TPZGeoElSide::SideTransform3(&thisGeoSide,&local_36f8,&t);
  iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x248))(this,side);
  if (iVar6 < 1) {
    iVar6 = 2;
  }
  else {
    iVar25 = 0;
    uVar8 = 1;
    do {
      pTVar12 = TPZInterpolatedElement::SideConnect((TPZInterpolatedElement *)this,iVar25,side);
      bVar2 = (pTVar12->field_2).fCompose.fOrder;
      if (uVar8 <= bVar2) {
        uVar8 = (uint)bVar2;
      }
      iVar25 = iVar25 + 1;
    } while (iVar6 != iVar25);
    iVar6 = uVar8 * 2;
  }
  iVar25 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))
                     (large,neighbourside);
  lVar11 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x318))(this,side);
  if ((iVar4 != 0) && ((int)(uint)*(byte *)(lVar11 + 0x14) < iVar25)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
               ,0x2c7);
  }
  pTVar13 = TPZCompEl::Reference((TPZCompEl *)this);
  plVar10 = (long *)(**(code **)(*(long *)pTVar13 + 0x70))(pTVar13,side,iVar6);
  if (plVar10 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - cannot create side integration rule",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    goto LAB_01227c5b;
  }
  iVar6 = (**(code **)(*plVar10 + 0x18))(plVar10);
  uVar8 = TPZInterpolatedElement::NSideShapeF((TPZInterpolatedElement *)this,side);
  uVar9 = TPZInterpolatedElement::NSideShapeF(large,neighbourside);
  pp_Var20 = (_func_int **)(long)(int)uVar8;
  pTVar26 = (TNode *)(long)(int)uVar9;
  local_2008.fElem = local_1f78;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  local_2008.fSize = 1000;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)pp_Var20;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = (int64_t)pTVar26;
  local_2008.fGiven = local_2008.fElem;
  TPZVec<int>::TPZVec(&local_2008.fPivot.super_TPZVec<int>,0);
  local_2008.fPivot.super_TPZVec<int>.fStore = local_2008.fPivot.fExtAlloc;
  local_2008.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2008.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2008.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2008.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2008.fWork.fStore = (double *)0x0;
  local_2008.fWork.fNElements = 0;
  local_2008.fWork.fNAlloc = 0;
  uVar14 = (long)pTVar26 * (long)pp_Var20;
  if (uVar14 == 0) {
    local_2008.fElem = (double *)0x0;
  }
  else if (1000 < (long)uVar14) {
    uVar21 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar21 = uVar14 * 8;
    }
    local_2008.fElem = (double *)operator_new__(uVar21);
  }
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  TPZFMatrix<double>::operator=(&local_2008,0.0);
  this_00 = (TPZFMatrix<double> *)operator_new(0x1fd8);
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = (int64_t)pp_Var20;
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = (int64_t)pp_Var20;
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  this_00->fElem = (double *)(this_00 + 1);
  this_00->fGiven = (double *)(this_00 + 1);
  this_00->fSize = 1000;
  TPZVec<int>::TPZVec(&(this_00->fPivot).super_TPZVec<int>,0);
  (this_00->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this_00->fPivot).super_TPZVec<int>.fStore = (this_00->fPivot).fExtAlloc;
  (this_00->fPivot).super_TPZVec<int>.fNElements = 0;
  (this_00->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this_00->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this_00->fWork).fStore = (double *)0x0;
  (this_00->fWork).fNElements = 0;
  (this_00->fWork).fNAlloc = 0;
  if (uVar8 == 0) {
    pdVar15 = (double *)0x0;
LAB_0122681a:
    this_00->fElem = pdVar15;
  }
  else {
    uVar14 = (long)pp_Var20 * (long)pp_Var20;
    if (1000 < uVar14) {
      uVar21 = 0xffffffffffffffff;
      if (uVar14 < 0x2000000000000000) {
        uVar21 = uVar14 * 8;
      }
      pdVar15 = (double *)operator_new__(uVar21);
      goto LAB_0122681a;
    }
  }
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  TPZFMatrix<double>::operator=(this_00,0.0);
  lVar11 = (long)iVar4;
  TPZManVector<double,_3>::TPZManVector(&par,lVar11);
  TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar5);
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::TPZVec(&centerPoint,lVar11,(double *)&local_3ab0);
  TPZGeoElSide::CenterPoint(&thisGeoSide,&centerPoint);
  local_3600.fElem = local_3570;
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_3600.fSize = 9;
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar11;
  local_3600.fGiven = local_3600.fElem;
  TPZVec<int>::TPZVec(&local_3600.fPivot.super_TPZVec<int>,0);
  local_3600.fPivot.super_TPZVec<int>.fStore = local_3600.fPivot.fExtAlloc;
  local_3600.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3600.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3600.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3600.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3600.fWork.fStore = (double *)0x0;
  local_3600.fWork.fNElements = 0;
  local_3600.fWork.fNAlloc = 0;
  uVar14 = lVar11 * lVar11;
  if (iVar4 == 0) {
    local_3600.fElem = (double *)0x0;
  }
  else if (9 < uVar14) {
    uVar21 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar21 = uVar14 * 8;
    }
    local_3600.fElem = (double *)operator_new__(uVar21);
  }
  local_3600.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_36e0.fElem = local_3650;
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_36e0.fSize = 9;
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar11;
  local_36e0.fGiven = local_36e0.fElem;
  TPZVec<int>::TPZVec(&local_36e0.fPivot.super_TPZVec<int>,0);
  local_36e0.fPivot.super_TPZVec<int>.fStore = local_36e0.fPivot.fExtAlloc;
  local_36e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_36e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_36e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_36e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_36e0.fWork.fStore = (double *)0x0;
  local_36e0.fWork.fNElements = 0;
  local_36e0.fWork.fNAlloc = 0;
  if (iVar4 == 0) {
    local_36e0.fElem = (double *)0x0;
  }
  else if (9 < uVar14) {
    uVar21 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar21 = uVar14 * 8;
    }
    local_36e0.fElem = (double *)operator_new__(uVar21);
  }
  local_36e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_3520.fElem = local_3490;
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_3520.fSize = 9;
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_3520.fGiven = local_3520.fElem;
  TPZVec<int>::TPZVec(&local_3520.fPivot.super_TPZVec<int>,0);
  local_3520.fPivot.super_TPZVec<int>.fStore = local_3520.fPivot.fExtAlloc;
  local_3520.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3520.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3520.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3520.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3520.fWork.fStore = (double *)0x0;
  local_3520.fWork.fNElements = 0;
  local_3520.fWork.fNAlloc = 0;
  if (iVar4 == 0) {
    local_3520.fElem = (double *)0x0;
  }
  else if (3 < iVar4) {
    local_3520.fElem = (double *)operator_new__(lVar11 * 0x18);
  }
  local_3520.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZGeoElSide::Jacobian(&thisGeoSide,&centerPoint,&local_3600,&local_3520,&detjac,&local_36e0);
  local_3ab0.fElem = local_3a20;
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_3ab0.fSize = 100;
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)pp_Var20;
  local_3ab0.fGiven = local_3ab0.fElem;
  TPZVec<int>::TPZVec(&local_3ab0.fPivot.super_TPZVec<int>,0);
  local_3ab0.fPivot.super_TPZVec<int>.fStore = local_3ab0.fPivot.fExtAlloc;
  local_3ab0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3ab0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ab0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ab0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3ab0.fWork.fStore = (double *)0x0;
  local_3ab0.fWork.fNElements = 0;
  local_3ab0.fWork.fNAlloc = 0;
  if (uVar8 == 0) {
    local_3ab0.fElem = (double *)0x0;
  }
  else if (0x21 < (int)uVar8) {
    local_3ab0.fElem = (double *)operator_new__((long)pp_Var20 * 0x18);
  }
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
       (int64_t)&MSolve.super_TPZMatrixSolver<double>.fScratch.fWork.fNElements;
  MSolve.super_TPZMatrixSolver<double>.fReferenceMatrix.fRef = (TPZReference *)0x3;
  MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow.
  _0_2_ = 0;
  MSolve.super_TPZMatrixSolver<double>.super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
       (TPZSavable)&PTR__TPZFMatrix_018379e0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fElem = (double *)0x64;
  MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = pp_Var20;
  MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
       MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.
       fCol;
  TPZVec<int>::TPZVec((TPZVec<int> *)&MSolve.super_TPZMatrixSolver<double>.fScratch.fGiven,0);
  MSolve.super_TPZMatrixSolver<double>.fScratch.fSize =
       (int64_t)&MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>.fNElements;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fGiven = (double *)&PTR__TPZManVector_01815498;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)0x0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>.fStore = (int *)0x0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.fExtAlloc._8_8_ = &PTR__TPZVec_01813df0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.fExtAlloc[4] = 0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot._52_4_ = 0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fWork._vptr_TPZVec = (_func_int **)0x0;
  MSolve.super_TPZMatrixSolver<double>.fScratch.fWork.fStore = (double *)0x0;
  if (uVar8 == 0) {
    MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
         0;
  }
  else if (0x21 < (int)uVar8) {
    MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
         (int64_t)operator_new__((long)pp_Var20 * 0x18);
  }
  MSolve.super_TPZMatrixSolver<double>.super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
       (TPZSavable)&PTR__TPZFNMatrix_018376f0;
  MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
       (int64_t)&MBlocksmall.fBlock.fExtAlloc[6].pos;
  MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (TNode *)0x3;
  MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNElements._0_2_ = 0;
  MBlocksmall.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018379e0;
  MBlocksmall.fBlock.fExtAlloc[0].pos = 100;
  MBlocksmall.fBlock.fExtAlloc[0].dim = 0;
  MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec = (_func_int **)pTVar26;
  MBlocksmall.fBlock.fExtAlloc[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
  TPZVec<int>::TPZVec((TPZVec<int> *)(MBlocksmall.fBlock.fExtAlloc + 1),0);
  MBlocksmall.fBlock.fExtAlloc[1]._8_8_ = MBlocksmall.fBlock.fExtAlloc + 3;
  MBlocksmall.fBlock.fExtAlloc[1].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZManVector_01815498;
  MBlocksmall.fBlock.fExtAlloc[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  MBlocksmall.fBlock.fExtAlloc[2].pos = 0;
  MBlocksmall.fBlock.fExtAlloc[2].dim = 0;
  MBlocksmall.fBlock.fExtAlloc[4]._8_8_ = &PTR__TPZVec_01813df0;
  MBlocksmall.fBlock.fExtAlloc[5].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  MBlocksmall.fBlock.fExtAlloc[5].pos = 0;
  MBlocksmall.fBlock.fExtAlloc[5].dim = 0;
  MBlocksmall.fBlock.fExtAlloc[6].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  if (uVar9 == 0) {
    MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  }
  else if (0x21 < (int)uVar9) {
    MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
         (int64_t)operator_new__((long)pTVar26 * 0x18);
  }
  MBlocksmall.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018376f0;
  MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
       (int64_t)&MBlocklarge.fBlock.fExtAlloc[6].pos;
  MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec = (_func_int **)0x3;
  MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNElements._0_2_ = 0;
  MBlocklarge.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018379e0;
  MBlocklarge.fBlock.fExtAlloc[0].pos = 100;
  MBlocklarge.fBlock.fExtAlloc[0].dim = 0;
  MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore = pTVar26;
  MBlocklarge.fBlock.fExtAlloc[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
  TPZVec<int>::TPZVec((TPZVec<int> *)(MBlocklarge.fBlock.fExtAlloc + 1),0);
  MBlocklarge.fBlock.fExtAlloc[1]._8_8_ = MBlocklarge.fBlock.fExtAlloc + 3;
  MBlocklarge.fBlock.fExtAlloc[1].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZManVector_01815498;
  MBlocklarge.fBlock.fExtAlloc[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  MBlocklarge.fBlock.fExtAlloc[2].pos = 0;
  MBlocklarge.fBlock.fExtAlloc[2].dim = 0;
  MBlocklarge.fBlock.fExtAlloc[4]._8_8_ = &PTR__TPZVec_01813df0;
  MBlocklarge.fBlock.fExtAlloc[5].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  MBlocklarge.fBlock.fExtAlloc[5].pos = 0;
  MBlocklarge.fBlock.fExtAlloc[5].dim = 0;
  MBlocklarge.fBlock.fExtAlloc[6].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  if (uVar9 == 0) {
    MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  }
  else if (0x21 < (int)uVar9) {
    MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
         (int64_t)operator_new__((long)pTVar26 * 0x18);
  }
  MBlocklarge.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_3440.fElem = local_33b0;
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_3440.fSize = 100;
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)pp_Var20;
  local_3440.fGiven = local_3440.fElem;
  TPZVec<int>::TPZVec(&local_3440.fPivot.super_TPZVec<int>,0);
  local_3440.fPivot.super_TPZVec<int>.fStore = local_3440.fPivot.fExtAlloc;
  local_3440.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3440.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3440.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3440.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3440.fWork.fStore = (double *)0x0;
  local_3440.fWork.fNElements = 0;
  local_3440.fWork.fNAlloc = 0;
  if (uVar8 == 0) {
    local_3440.fElem = (double *)0x0;
  }
  else if (0x21 < (int)uVar8) {
    local_3440.fElem = (double *)operator_new__((long)pp_Var20 * 0x18);
  }
  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_2560.fElem = local_24d0;
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_2560.fSize = 100;
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)pTVar26;
  local_2560.fGiven = local_2560.fElem;
  TPZVec<int>::TPZVec(&local_2560.fPivot.super_TPZVec<int>,0);
  local_2560.fPivot.super_TPZVec<int>.fStore = local_2560.fPivot.fExtAlloc;
  local_2560.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2560.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2560.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2560.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2560.fWork.fStore = (double *)0x0;
  local_2560.fWork.fNElements = 0;
  local_2560.fWork.fNAlloc = 0;
  if (uVar9 == 0) {
    local_2560.fElem = (double *)0x0;
  }
  else if (0x21 < (int)uVar9) {
    local_2560.fElem = (double *)operator_new__((long)pTVar26 * 0x18);
  }
  local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  if (0 < iVar6) {
    iVar4 = 0;
    do {
      (**(code **)(*plVar10 + 0x20))(plVar10,iVar4,&par,&weight);
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x288))(this,side,&par,&local_3440,&MSolve);
      TPZTransform<double>::Apply(&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
      (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                (large,neighbourside,&pointl,&local_2560,&MBlocklarge);
      if (0 < (int)uVar8) {
        uVar14 = 0;
        do {
          uVar21 = 0;
          do {
            local_3c18 = 0.0;
            lVar11 = 0;
            do {
              if (local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar11 ||
                  local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                 (local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar11)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3c18 = local_3c18 +
                           local_3440.fElem
                           [local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar11 +
                            uVar14] *
                           local_3440.fElem
                           [local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar11 +
                            uVar21];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            lVar11 = (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar11 <= (long)uVar14) ||
               ((this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar21)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = lVar11 * uVar21;
            this_00->fElem[lVar11 + uVar14] = local_3c18 * weight + this_00->fElem[lVar11 + uVar14];
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar8);
          if (0 < (int)uVar9) {
            uVar21 = 0;
            do {
              local_3c18 = 0.0;
              lVar11 = 0;
              do {
                if ((local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
                   (local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar11)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                   (local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar11)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_3c18 = local_3c18 +
                             local_3440.fElem
                             [local_3440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar11 +
                              uVar14] *
                             local_2560.fElem
                             [local_2560.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar11 +
                              uVar21];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if ((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
                 (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_2008.fElem
              [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + uVar14] =
                   local_3c18 * weight +
                   local_2008.fElem
                   [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + uVar14];
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar9);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar8);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar6);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_2560,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3440,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MBlocklarge,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MBlocksmall,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MSolve,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ab0,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3520,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_36e0,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_3600,&PTR_PTR_01816200);
  centerPoint._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (centerPoint.fStore != (double *)0x0) {
    operator_delete__(centerPoint.fStore);
  }
  local_3b98.fRef = (TPZReference *)0x0;
  local_3b98.fRef = (TPZReference *)operator_new(0x10);
  ((local_3b98.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_3b98.fRef)->fPointer = (TPZMatrix<double> *)this_00;
  LOCK();
  ((local_3b98.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3b98);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3b98);
  TPZStepSolver<double>::SetDirect(&MSolve,ELU);
  TPZStepSolver<double>::Solve(&MSolve,&local_2008,&local_2008,(TPZFMatrix<double> *)0x0);
  uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x248))(this,side);
  uVar9 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                    (large);
  TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,uVar8,1);
  TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,uVar9,1);
  if (0 < (int)uVar8) {
    uVar18 = 0;
    do {
      uVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x250))(this,uVar18,side);
      lVar11 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,uVar7);
      TPZBlock::Set(&MBlocksmall,uVar18,*(int *)(lVar11 + 0x18),-1);
      uVar18 = uVar18 + 1;
    } while (uVar8 != uVar18);
  }
  if (0 < (int)uVar9) {
    uVar18 = 0;
    do {
      uVar7 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (large,uVar18,neighbourside);
      lVar11 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                         (large,uVar7);
      TPZBlock::Set(&MBlocklarge,uVar18,*(int *)(lVar11 + 0x18),-1);
      uVar18 = uVar18 + 1;
    } while (uVar9 != uVar18);
  }
  TPZBlock::Resequence(&MBlocksmall,0);
  TPZBlock::Resequence(&MBlocklarge,0);
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816bf8;
  local_3ab0.fElem = local_3a20;
  local_3ab0.fSize = 0x14;
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)uVar8;
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = (long)(int)uVar9;
  local_3ab0.fGiven = local_3ab0.fElem;
  TPZVec<int>::TPZVec(&local_3ab0.fPivot.super_TPZVec<int>,0);
  local_3ab0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3ab0.fPivot.super_TPZVec<int>.fStore = local_3ab0.fPivot.fExtAlloc;
  local_3ab0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ab0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ab0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3ab0.fWork.fStore = (double *)0x0;
  local_3ab0.fWork.fNElements = 0;
  local_3ab0.fWork.fNAlloc = 0;
  uVar14 = (long)(int)uVar9 * (long)(int)uVar8;
  if (uVar14 == 0) {
    local_3ab0.fElem = (double *)0x0;
  }
  else if (0x14 < (long)uVar14) {
    uVar21 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar21 = uVar14 * 8;
    }
    local_3ab0.fElem = (double *)operator_new__(uVar21);
  }
  local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01816908;
  TPZFMatrix<double>::operator=(&local_3ab0,0.0);
  uVar14 = (ulong)uVar9;
  if (0 < (int)uVar8) {
    uVar21 = 0;
    do {
      uVar18 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar21].dim;
      if ((ulong)uVar18 != 0 && 0 < (int)uVar9) {
        uVar22 = 0;
        do {
          uVar3 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar22].dim;
          if ((ulong)uVar3 != 0) {
            if (0 < (int)uVar18) {
              iVar4 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar21].pos;
              iVar5 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar22].pos;
              local_3bf0 = 0;
              do {
                if (0 < (int)uVar3) {
                  lVar11 = local_3bf0 + (long)iVar4;
                  uVar19 = (ulong)uVar3;
                  lVar23 = (long)iVar5;
                  do {
                    if (((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11 ||
                          lVar11 < 0) || (lVar23 < 0)) ||
                       (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    if (((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11 ||
                          lVar11 < 0) || (lVar23 < 0)) ||
                       (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    if ((local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21
                        ) || (local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
                              (long)uVar22)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    local_3ab0.fElem
                    [local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22 + uVar21]
                         = ABS(local_2008.fElem
                               [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar23
                                + lVar11]) *
                           ABS(local_2008.fElem
                               [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar23
                                + lVar11]) +
                           local_3ab0.fElem
                           [local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22 +
                            uVar21];
                    lVar23 = lVar23 + 1;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
                local_3bf0 = local_3bf0 + 1;
              } while (local_3bf0 != uVar18);
            }
            if ((local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
               (local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar22)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22;
            local_3ab0.fElem[lVar11 + uVar21] =
                 local_3ab0.fElem[lVar11 + uVar21] / (double)(int)(uVar18 * uVar3);
            if ((local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
               (local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar22)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar1 = local_3ab0.fElem[lVar11 + uVar21];
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
            if ((local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
               (local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar22)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_3ab0.fElem
            [local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22 + uVar21] = dVar1;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar14);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar8);
  }
  uVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  pTVar12 = (TPZConnect *)
            (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar7);
  uVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  myindex = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa0))(this,uVar7);
  if (0 < (int)uVar9) {
    lVar23 = (long)(int)(uVar8 - 1);
    lVar11 = 0xc;
    uVar21 = 0;
    lVar24 = 0;
    do {
      if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar23].dim != 0) &&
         (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                          super_TPZSavable)._vptr_TPZSavable + lVar11) != 0)) {
        iVar16 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar21,neighbourside);
        pTVar17 = TPZConnect::AddDependency
                            (pTVar12,myindex,iVar16,&local_2008,
                             (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar23].
                                   pos,
                             (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                                  fStore + lVar11 + -4),
                             MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar23].dim,
                             *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                              fStore)->super_TPZSavable)._vptr_TPZSavable + lVar11))
        ;
        if (((int)uVar8 < 1) ||
           ((local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23 ||
            (local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)))) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (local_3ab0.fElem
            [local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + lVar23] <= 1e-08
            && local_3ab0.fElem
               [local_3ab0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + lVar23] !=
               1e-08) {
          memset((pTVar17->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                 (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow *
                 (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fCol * 8);
          (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
          .fDecomposed = '\0';
        }
        lVar24 = lVar24 + 1;
      }
      uVar21 = uVar21 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar14 != uVar21);
    if (lVar24 == 0 && 0 < (int)uVar9) {
      lVar11 = 0xc;
      uVar21 = 0;
      do {
        iVar16 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar21,neighbourside);
        iVar4 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                super_TPZSavable)._vptr_TPZSavable + lVar11);
        if (iVar4 != 0) {
          TPZConnect::AddDependency
                    (pTVar12,myindex,iVar16,&local_2008,
                     (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar23].pos,
                     (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore +
                                   lVar11 + -4),
                     MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar23].dim,iVar4);
        }
        uVar21 = uVar21 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar14 != uVar21);
    }
  }
  (**(code **)(*plVar10 + 8))(plVar10);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ab0,&PTR_PTR_01816bc0);
  TPZBlock::~TPZBlock(&MBlocklarge);
  TPZBlock::~TPZBlock(&MBlocksmall);
  TPZStepSolver<double>::~TPZStepSolver(&MSolve);
  TPZManVector<double,_3>::~TPZManVector(&pointl);
  TPZManVector<double,_3>::~TPZManVector(&par);
  TPZFMatrix<double>::~TPZFMatrix(&local_2008,&PTR_PTR_0185cbd8);
LAB_01227c5b:
  TPZTransform<double>::~TPZTransform(&t);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    const TPZCompElSide thisCompSide(this, side);
    const TPZCompElSide largeCompSide(large, neighbourside);
    TPZGeoElSide thisGeoSide(this->Reference(), side);
    const TPZGeoElSide largeGeoSide = largeCompSide.Reference();
    const auto thisSideDimension = thisGeoSide.Dimension();
    const auto largeSideDimension = largeGeoSide.Dimension();


    TPZInterpolatedElement *largeCel = nullptr;
    if (largeCompSide.Exists()) largeCel = dynamic_cast<TPZInterpolatedElement *> (largeCompSide.Element());
    if (!largeCel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    const auto connectLocId = this->MidSideConnectLocId(side);
    if (connectLocId < 0) {
        DebugStop();
    }
    const TPZConnect &myConnect = this->Connect(connectLocId);
    if (myConnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myConnect.HasDependency() && largeSideDimension > 0) {
        LOGPZ_ERROR(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (largeCel->ConnectIndex(largeCel->MidSideConnectLocId(largeCompSide.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largeSideDimension == 0) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - dimension of large element is 0");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisSideDimension);
    thisGeoSide.SideTransform3(largeGeoSide, t);
    const auto nSideConnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nSideConnects; sidecon++) {
        TPZConnect &c = this->SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    const auto largeOrder = large->EffectiveSideOrder(neighbourside);
    const auto sideOrder = this->MidSideConnect(side).Order();
    if (sideOrder < largeOrder && thisSideDimension && largeSideDimension) {
        DebugStop();
    }
    TPZIntPoints *intrule = this->Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    const auto numint = intrule->NPoints();
    const auto numshape = this->NSideShapeF(side);
    const auto numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(thisSideDimension), pointl(largeSideDimension);

    {
        REAL detjac;
        TPZVec<REAL> centerPoint(thisSideDimension,0);
        thisGeoSide.CenterPoint(centerPoint);
        TPZFNMatrix<9,REAL> jac(thisSideDimension,thisSideDimension),jacinv(thisSideDimension,thisSideDimension),axes(thisSideDimension,3);
        thisGeoSide.Jacobian(centerPoint, jac, axes, detjac, jacinv);
        REAL weight;
        TPZFNMatrix<100, REAL> phis(numshape, 3), dphis(3, numshape), phil(numshapel, 3), dphil(3, numshapel);
        TPZFNMatrix<100, REAL> thisTrace(numshape, 3), largeTrace(numshapel, 3);
        for (int it = 0; it < numint; it++) {
            intrule->Point(it, par, weight);
            SideShapeFunction(side, par, thisTrace, dphis);
            t.Apply(par, pointl);
            large->SideShapeFunction(neighbourside, pointl, largeTrace, dphil);
            for (auto in = 0; in < numshape; in++) {
                for (auto jn = 0; jn < numshape; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * thisTrace(jn,iaxes);
                    }
                    (*M)(in, jn) += dotProduct * weight;
                }
                for (auto jn = 0; jn < numshapel; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * largeTrace(jn,iaxes);
                    }
                    MSL(in, jn) += dotProduct * weight;
                }
            }
        }
    }

#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    const auto thisNumSideNodes = NSideConnects(side);
    const auto largeNumSideNodes = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, thisNumSideNodes), MBlocklarge(0, largeNumSideNodes);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = this->Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (auto in = 0; in < largeNumSideNodes; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(thisNumSideNodes, largeNumSideNodes, 0.);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    this->CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = this->Connect(this->MidSideConnectLocId(side));
    const auto inodindex = ConnectIndex(this->MidSideConnectLocId(side));
    int64_t ndepend = 0;
    const auto in = thisNumSideNodes - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (auto jn = 0; jn < largeNumSideNodes; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                                           MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                   MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // restraint matrix should be equal to MSL
    {
        TPZCheckRestraint test(thisCompSide, largeCompSide);
        int64_t imsl, jmsl;
        const int64_t rmsl = MSL.Rows();
        const int64_t cmsl = MSL.Cols();
        const int64_t rtest = test.RestraintMatrix().Rows();
        const int64_t ctest = test.RestraintMatrix().Cols();

        if (rtest != rmsl || ctest != cmsl) {
            std::stringstream sout;
            sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                 << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n";
            LOGPZ_ERROR(logger, sout.str())
            return;
        }

        TPZFMatrix<REAL> mslc(MSL);
        mslc -= test.RestraintMatrix();

        REAL normmsl = 0.;
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
            }
        }
        if (normmsl > 1.E-6) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
            mslc.Print("Difference Matrix ", sout);
            for (imsl = 0; imsl < rmsl; imsl++) {
                for (jmsl = 0; jmsl < cmsl; jmsl++) {
                    if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                        sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                             << test.RestraintMatrix()(imsl, jmsl) << std::endl;
                    }
                }
            }
            LOGPZ_ERROR(logger, sout.str())
        }

        if (test.CheckRestraint()) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::Bad restraints detected\n";
            test.Print(sout);
            test.Diagnose();
            LOGPZ_ERROR(logger, sout.str())
        }
    }
#endif
}